

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsslconfiguration.cpp
# Opt level: O1

void __thiscall
QSslConfiguration::setAllowedNextProtocols(QSslConfiguration *this,QList<QByteArray> *protocols)

{
  QSslConfigurationPrivate *pQVar1;
  
  pQVar1 = (this->d).d.ptr;
  if ((pQVar1 != (QSslConfigurationPrivate *)0x0) &&
     ((__atomic_base<int>)
      *(__int_type *)
       &(pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value != (__atomic_base<int>)0x1)) {
    QSharedDataPointer<QSslConfigurationPrivate>::detach_helper(&this->d);
  }
  QArrayDataPointer<QByteArray>::operator=
            (&(((this->d).d.ptr)->nextAllowedProtocols).d,&protocols->d);
  return;
}

Assistant:

void QSslConfiguration::setAllowedNextProtocols(const QList<QByteArray> &protocols)
{
    d->nextAllowedProtocols = protocols;
}